

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
ChainstateManager::ProcessNewBlockHeaders
          (ChainstateManager *this,span<const_CBlockHeader,_18446744073709551615UL> headers,
          bool min_pow_checked,BlockValidationState *state,CBlockIndex **ppindex)

{
  long lVar1;
  CBlockIndex *pCVar2;
  bool bVar3;
  bool bVar4;
  time_point tVar5;
  long lVar6;
  CBlockHeader *block;
  iterator __begin1;
  long lVar7;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  
  block = headers._M_ptr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock32.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock32.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock32.super_unique_lock);
  if (headers._M_extent._M_extent_value._M_extent_value != 0) {
    lVar7 = headers._M_extent._M_extent_value._M_extent_value * 0x50;
    do {
      pindex = (CBlockIndex *)0x0;
      bVar3 = AcceptBlockHeader(this,block,state,&pindex,min_pow_checked);
      CheckBlockIndex(this);
      if (!bVar3) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
        bVar3 = false;
        goto LAB_00ae378d;
      }
      if (ppindex != (CBlockIndex **)0x0) {
        *ppindex = pindex;
      }
      block = block + 1;
      lVar7 = lVar7 + -0x50;
    } while (lVar7 != 0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock32.super_unique_lock);
  bVar4 = NotifyHeaderTip(this);
  bVar3 = true;
  if (bVar4) {
    bVar4 = IsInitialBlockDownload(this);
    if ((ppindex != (CBlockIndex **)0x0 && bVar4) &&
       (pCVar2 = *ppindex, pCVar2 != (CBlockIndex *)0x0)) {
      tVar5 = NodeClock::now();
      lVar6 = (long)((long)tVar5.__d.__r + (ulong)pCVar2->nTime * -1000000000) /
              ((((this->m_options).chainparams)->consensus).nPowTargetSpacing * 1000000000);
      lVar7 = 0;
      if (0 < lVar6) {
        lVar7 = lVar6;
      }
      criticalblock32.super_unique_lock._M_device =
           (mutex_type *)(((double)pCVar2->nHeight * 100.0) / (double)(lVar7 + pCVar2->nHeight));
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ProcessNewBlockHeaders";
      logging_function._M_len = 0x16;
      LogPrintFormatInternal<int,double>
                (logging_function,source_file,0x1133,ALL,Info,(ConstevalFormatString<2U>)0xfb27a6,
                 &pCVar2->nHeight,(double *)&criticalblock32.super_unique_lock);
    }
  }
LAB_00ae378d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ProcessNewBlockHeaders(std::span<const CBlockHeader> headers, bool min_pow_checked, BlockValidationState& state, const CBlockIndex** ppindex)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        for (const CBlockHeader& header : headers) {
            CBlockIndex *pindex = nullptr; // Use a temp pindex instead of ppindex to avoid a const_cast
            bool accepted{AcceptBlockHeader(header, state, &pindex, min_pow_checked)};
            CheckBlockIndex();

            if (!accepted) {
                return false;
            }
            if (ppindex) {
                *ppindex = pindex;
            }
        }
    }
    if (NotifyHeaderTip()) {
        if (IsInitialBlockDownload() && ppindex && *ppindex) {
            const CBlockIndex& last_accepted{**ppindex};
            int64_t blocks_left{(NodeClock::now() - last_accepted.Time()) / GetConsensus().PowTargetSpacing()};
            blocks_left = std::max<int64_t>(0, blocks_left);
            const double progress{100.0 * last_accepted.nHeight / (last_accepted.nHeight + blocks_left)};
            LogInfo("Synchronizing blockheaders, height: %d (~%.2f%%)\n", last_accepted.nHeight, progress);
        }
    }
    return true;
}